

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void google::protobuf::FillArenaAwareFields(TestAllTypes *message)

{
  undefined8 uVar1;
  OneofFieldCase OVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  TestAllTypes_NestedMessage *pTVar5;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string test_string;
  TestAllTypes *message_local;
  
  test_string.field_2._8_8_ = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"hello world",&local_91);
  std::allocator<char>::~allocator(&local_91);
  proto2_unittest::TestAllTypes::set_optional_int32((TestAllTypes *)test_string.field_2._8_8_,0x2a);
  uVar1 = test_string.field_2._8_8_;
  puVar3 = internal::HasBits<2>::operator[]((HasBits<2> *)(test_string.field_2._8_8_ + 0x10),0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = MessageLite::GetArena((MessageLite *)uVar1);
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(uVar1 + 0x1f8),(string *)local_90,pAVar4);
  uVar1 = test_string.field_2._8_8_;
  puVar3 = internal::HasBits<2>::operator[]((HasBits<2> *)(test_string.field_2._8_8_ + 0x10),0);
  *(byte *)puVar3 = (byte)*puVar3 | 2;
  pAVar4 = MessageLite::GetArena((MessageLite *)uVar1);
  internal::ArenaStringPtr::SetBytes<>((ArenaStringPtr *)(uVar1 + 0x200),(string *)local_90,pAVar4);
  pTVar5 = proto2_unittest::TestAllTypes::mutable_optional_nested_message
                     ((TestAllTypes *)test_string.field_2._8_8_);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar5,0x2a);
  proto2_unittest::TestAllTypes::set_oneof_uint32((TestAllTypes *)test_string.field_2._8_8_,0x2a);
  pTVar5 = proto2_unittest::TestAllTypes::mutable_oneof_nested_message
                     ((TestAllTypes *)test_string.field_2._8_8_);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar5,0x2a);
  uVar1 = test_string.field_2._8_8_;
  OVar2 = proto2_unittest::TestAllTypes::oneof_field_case((TestAllTypes *)test_string.field_2._8_8_)
  ;
  if (OVar2 != kOneofString) {
    proto2_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)uVar1);
    proto2_unittest::TestAllTypes::set_has_oneof_string((TestAllTypes *)uVar1);
    internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)(uVar1 + 0x330));
  }
  pAVar4 = MessageLite::GetArena((MessageLite *)uVar1);
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)(uVar1 + 0x330),(string *)local_90,pAVar4);
  uVar1 = test_string.field_2._8_8_;
  OVar2 = proto2_unittest::TestAllTypes::oneof_field_case((TestAllTypes *)test_string.field_2._8_8_)
  ;
  if (OVar2 != kOneofBytes) {
    proto2_unittest::TestAllTypes::clear_oneof_field((TestAllTypes *)uVar1);
    proto2_unittest::TestAllTypes::set_has_oneof_bytes((TestAllTypes *)uVar1);
    internal::ArenaStringPtr::InitDefault((ArenaStringPtr *)(uVar1 + 0x330));
  }
  pAVar4 = MessageLite::GetArena((MessageLite *)uVar1);
  internal::ArenaStringPtr::SetBytes<>((ArenaStringPtr *)(uVar1 + 0x330),(string *)local_90,pAVar4);
  proto2_unittest::TestAllTypes::add_repeated_int32((TestAllTypes *)test_string.field_2._8_8_,0x2a);
  pTVar5 = proto2_unittest::TestAllTypes::add_repeated_nested_message
                     ((TestAllTypes *)test_string.field_2._8_8_);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar5,0x2a);
  pTVar5 = proto2_unittest::TestAllTypes::mutable_optional_lazy_message
                     ((TestAllTypes *)test_string.field_2._8_8_);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar5,0x2a);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void FillArenaAwareFields(TestAllTypes* message) {
  std::string test_string = "hello world";
  message->set_optional_int32(42);
  message->set_optional_string(test_string);
  message->set_optional_bytes(test_string);
  message->mutable_optional_nested_message()->set_bb(42);

  message->set_oneof_uint32(42);
  message->mutable_oneof_nested_message()->set_bb(42);
  message->set_oneof_string(test_string);
  message->set_oneof_bytes(test_string);

  message->add_repeated_int32(42);
  // No repeated string: not yet arena-aware.
  message->add_repeated_nested_message()->set_bb(42);
  message->mutable_optional_lazy_message()->set_bb(42);
}